

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O0

expression * copy_expression(dmr_C *C,expression *expr)

{
  ptr_list *ppVar1;
  expression *peVar2;
  statement *psVar3;
  symbol *psVar4;
  expression *peVar5;
  expression *idx;
  expression *val_1;
  expression *val;
  expression *sub_expr_1;
  expression *sub_expr;
  symbol *label_symbol;
  ptr_list_iter entryiter__;
  expression *entry;
  expression_list *list_1;
  ptr_list_iter argiter__;
  expression *arg;
  expression_list *list;
  expression *fn;
  statement *stmt;
  expression *falsee;
  expression *truee;
  expression *cond;
  expression *cast_1;
  symbol *sym_1;
  expression *cast;
  expression *deref;
  expression *right_1;
  expression *left_1;
  expression *right;
  expression *left;
  expression *base;
  expression *unop;
  symbol *sym;
  expression *expr_local;
  dmr_C *C_local;
  
  if (expr == (expression *)0x0) {
    return (expression *)0x0;
  }
  sym = (symbol *)expr;
  switch(*(undefined1 *)expr) {
  case 1:
  case 2:
  case 4:
  case 0x1c:
    break;
  case 3:
    psVar4 = copy_symbol(C,expr->pos,(expr->field_5).field_4.symbol);
    if (psVar4 != (symbol *)(expr->field_5).field_0.value) {
      sym = (symbol *)dup_expression(C,expr);
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_4).symbol = psVar4;
    }
    break;
  case 5:
  case 7:
  case 0x15:
  case 0x16:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    if ((peVar5 != (expression *)(expr->field_5).field_0.value) ||
       (psVar4 != (symbol *)(expr->field_5).field_2.string)) {
      sym = (symbol *)dup_expression(C,expr);
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
      sym->replace = psVar4;
    }
    break;
  case 6:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    if (((expr->op != 0x3d) || (peVar5 != (expression *)(expr->field_5).field_0.value)) ||
       (psVar4 != (symbol *)(expr->field_5).field_2.string)) {
      sym = (symbol *)dup_expression(C,expr);
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
      sym->replace = psVar4;
    }
    break;
  case 8:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    sym = (symbol *)dup_expression(C,expr);
    (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
    break;
  case 9:
  case 10:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    if ((expression *)(expr->field_5).field_0.value != peVar5) {
      sym = (symbol *)dup_expression(C,expr);
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
    }
    break;
  case 0xb:
    if (((uint)*(expr->field_5).field_2.string & 0xff) == 0x18) {
      peVar5 = (expr->field_5).field_6.right;
      psVar3 = (expr->field_5).statement;
      peVar2 = dup_expression(C,expr);
      peVar5 = copy_expression(C,peVar5);
      *(expression **)((long)&peVar2->field_5 + 8) = peVar5;
      psVar4 = dmrC_alloc_symbol(C->S,psVar3->pos,psVar3->type & 0xff);
      (peVar2->field_5).field_4.symbol = psVar4;
      memcpy((peVar2->field_5).field_3.unop,psVar3,0xe8);
      return peVar2;
    }
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    if (psVar4 != (symbol *)(expr->field_5).field_2.string) {
      sym = (symbol *)dup_expression(C,expr);
      sym->replace = psVar4;
    }
    break;
  case 0x11:
  case 0x12:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    peVar2 = copy_expression(C,(expr->field_5).field_10.cond_false);
    if (((peVar5 != (expression *)(expr->field_5).field_0.value) ||
        (psVar4 != (symbol *)(expr->field_5).field_2.string)) ||
       (peVar2 != (expr->field_5).field_10.cond_false)) {
      sym = (symbol *)dup_expression(C,expr);
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
      sym->replace = psVar4;
      sym->scope = (scope *)peVar2;
    }
    break;
  case 0x13:
    psVar3 = dmrC_alloc_statement(C,expr->pos,3);
    dmrC_copy_statement(C,(expr->field_5).statement,psVar3);
    sym = (symbol *)dup_expression(C,expr);
    ((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->statement = psVar3;
    break;
  case 0x14:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    ppVar1 = (ptr_list *)(expr->field_5).field_2.string;
    sym = (symbol *)dup_expression(C,expr);
    (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
    sym->replace = (symbol *)0x0;
    ptrlist_forward_iterator((ptr_list_iter *)&list_1,ppVar1);
    argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&list_1);
    while (argiter__._16_8_ != 0) {
      peVar5 = copy_expression(C,(expression *)argiter__._16_8_);
      dmrC_add_expression(C,(expression_list **)&sym->replace,peVar5);
      argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&list_1);
    }
    break;
  case 0x17:
    psVar4 = copy_symbol(C,expr->pos,(expr->field_5).field_4.symbol);
    sym = (symbol *)dup_expression(C,expr);
    (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_4).symbol = psVar4;
    break;
  case 0x18:
    ppVar1 = (ptr_list *)(expr->field_5).field_3.unop;
    sym = (symbol *)dup_expression(C,expr);
    (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_0).value = 0;
    ptrlist_forward_iterator((ptr_list_iter *)&label_symbol,ppVar1);
    entryiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&label_symbol);
    while (entryiter__._16_8_ != 0) {
      peVar5 = copy_expression(C,(expression *)entryiter__._16_8_);
      dmrC_add_expression(C,&((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->
                             expr_list,peVar5);
      entryiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&label_symbol);
    }
    break;
  case 0x19:
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_14.ident_expression);
    sym = (symbol *)dup_expression(C,expr);
    (sym->field_12).same_symbol = psVar4;
    break;
  case 0x1a:
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    sym = (symbol *)dup_expression(C,expr);
    sym->replace = psVar4;
    break;
  case 0x1b:
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    sym = (symbol *)dup_expression(C,expr);
    sym->replace = psVar4;
    break;
  case 0x1d:
    peVar5 = copy_expression(C,(expr->field_5).field_3.unop);
    sym = (symbol *)dup_expression(C,expr);
    (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop = peVar5;
    break;
  case 0x1e:
    psVar4 = (symbol *)copy_expression(C,(expr->field_5).field_6.right);
    if (expr->op == 0x2e) {
      if ((symbol *)(expr->field_5).field_2.string != psVar4) {
        sym = (symbol *)dup_expression(C,expr);
        sym->replace = psVar4;
      }
    }
    else {
      peVar5 = copy_expression(C,(expr->field_5).field_10.cond_false);
      if (((symbol *)(expr->field_5).field_2.string != psVar4) ||
         ((expr->field_5).field_10.cond_false != peVar5)) {
        sym = (symbol *)dup_expression(C,expr);
        sym->replace = psVar4;
        sym->scope = (scope *)peVar5;
      }
    }
    break;
  default:
    dmrC_warning(C,expr->pos,"trying to copy expression type %d",(ulong)(*(ushort *)expr & 0xff));
  }
  return (expression *)sym;
}

Assistant:

static struct expression * copy_expression(struct dmr_C *C, struct expression *expr)
{
	if (!expr)
		return NULL;

	switch (expr->type) {
	/*
	 * EXPR_SYMBOL is the interesting case, we may need to replace the
	 * symbol to the new copy.
	 */
	case EXPR_SYMBOL: {
		struct symbol *sym = copy_symbol(C, expr->pos, expr->symbol);
		if (sym == expr->symbol)
			break;
		expr = dup_expression(C, expr);
		expr->symbol = sym;
		break;
	}

	/* Atomics, never change, just return the expression directly */
	case EXPR_VALUE:
	case EXPR_STRING:
	case EXPR_FVALUE:
	case EXPR_TYPE:
		break;

	/* Unops: check if the subexpression is unique */
	case EXPR_PREOP:
	case EXPR_POSTOP: {
		struct expression *unop = copy_expression(C, expr->unop);
		if (expr->unop == unop)
			break;
		expr = dup_expression(C, expr);
		expr->unop = unop;
		break;
	}

	case EXPR_SLICE: {
		struct expression *base = copy_expression(C, expr->base);
		expr = dup_expression(C, expr);
		expr->base = base;
		break;
	}

	/* Binops: copy left/right expressions */
	case EXPR_BINOP:
	case EXPR_COMMA:
	case EXPR_COMPARE:
	case EXPR_LOGICAL: {
		struct expression *left = copy_expression(C, expr->left);
		struct expression *right = copy_expression(C, expr->right);
		if (left == expr->left && right == expr->right)
			break;
		expr = dup_expression(C, expr);
		expr->left = left;
		expr->right = right;
		break;
	}

	case EXPR_ASSIGNMENT: {
		struct expression *left = copy_expression(C, expr->left);
		struct expression *right = copy_expression(C, expr->right);
		if (expr->op == '=' && left == expr->left && right == expr->right)
			break;
		expr = dup_expression(C, expr);
		expr->left = left;
		expr->right = right;
		break;
	}

	/* Dereference */
	case EXPR_DEREF: {
		struct expression *deref = copy_expression(C, expr->deref);
		expr = dup_expression(C, expr);
		expr->deref = deref;
		break;
	}

	/* Cast/sizeof/__alignof__ */
	case EXPR_CAST:
		if (expr->cast_expression->type == EXPR_INITIALIZER) {
			struct expression *cast = expr->cast_expression;
			struct symbol *sym = expr->cast_type;
			expr = dup_expression(C, expr);
			expr->cast_expression = copy_expression(C, cast);
			expr->cast_type = dmrC_alloc_symbol(C->S, sym->pos, sym->type);
			*expr->cast_type = *sym;
			break;
		}
	case EXPR_FORCE_CAST:
	case EXPR_IMPLIED_CAST:
	case EXPR_SIZEOF: 
	case EXPR_PTRSIZEOF:
	case EXPR_ALIGNOF: {
		struct expression *cast = copy_expression(C, expr->cast_expression);
		if (cast == expr->cast_expression)
			break;
		expr = dup_expression(C, expr);
		expr->cast_expression = cast;
		break;
	}

	/* Conditional expression */
	case EXPR_SELECT:
	case EXPR_CONDITIONAL: {
		struct expression *cond = copy_expression(C, expr->conditional);
		struct expression *truee = copy_expression(C, expr->cond_true);
		struct expression *falsee = copy_expression(C, expr->cond_false);
		if (cond == expr->conditional && truee == expr->cond_true && falsee == expr->cond_false)
			break;
		expr = dup_expression(C, expr);
		expr->conditional = cond;
		expr->cond_true = truee;
		expr->cond_false = falsee;
		break;
	}

	/* Statement expression */
	case EXPR_STATEMENT: {
		struct statement *stmt = dmrC_alloc_statement(C, expr->pos, STMT_COMPOUND);
		dmrC_copy_statement(C, expr->statement, stmt);
		expr = dup_expression(C, expr);
		expr->statement = stmt;
		break;
	}

	/* Call expression */
	case EXPR_CALL: {
		struct expression *fn = copy_expression(C, expr->fn);
		struct expression_list *list = expr->args;
		struct expression *arg;

		expr = dup_expression(C, expr);
		expr->fn = fn;
		expr->args = NULL;
		FOR_EACH_PTR(list, arg) {
			dmrC_add_expression(C, &expr->args, copy_expression(C, arg));
		} END_FOR_EACH_PTR(arg);
		break;
	}

	/* Initializer list statement */
	case EXPR_INITIALIZER: {
		struct expression_list *list = expr->expr_list;
		struct expression *entry;
		expr = dup_expression(C, expr);
		expr->expr_list = NULL;
		FOR_EACH_PTR(list, entry) {
			dmrC_add_expression(C, &expr->expr_list, copy_expression(C, entry));
		} END_FOR_EACH_PTR(entry);
		break;
	}

	/* Label in inline function - hmm. */
	case EXPR_LABEL: {
		struct symbol *label_symbol = copy_symbol(C, expr->pos, expr->label_symbol);
		expr = dup_expression(C, expr);
		expr->label_symbol = label_symbol;
		break;
	}

	case EXPR_INDEX: {
		struct expression *sub_expr = copy_expression(C, expr->idx_expression);
		expr = dup_expression(C, expr);
		expr->idx_expression = sub_expr;
		break;
	}
		
	case EXPR_IDENTIFIER: {
		struct expression *sub_expr = copy_expression(C, expr->ident_expression);
		expr = dup_expression(C, expr);
		expr->ident_expression = sub_expr;
		break;
	}

	/* Position in initializer.. */
	case EXPR_POS: {
		struct expression *val = copy_expression(C, expr->init_expr);
		expr = dup_expression(C, expr);
		expr->init_expr = val;
		break;
	}
	case EXPR_OFFSETOF: {
		struct expression *val = copy_expression(C, expr->down);
		if (expr->op == '.') {
			if (expr->down != val) {
				expr = dup_expression(C, expr);
				expr->down = val;
			}
		} else {
			struct expression *idx = copy_expression(C, expr->index);
			if (expr->down != val || expr->index != idx) {
				expr = dup_expression(C, expr);
				expr->down = val;
				expr->index = idx;
			}
		}
		break;
	}
	default:
		dmrC_warning(C, expr->pos, "trying to copy expression type %d", expr->type);
	}
	return expr;
}